

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_number_decimal(void)

{
  byte bVar1;
  int iVar2;
  _Bool r;
  bson_t b;
  char *json;
  bson_decimal128_t decimal128;
  bson_iter_t iter;
  bson_error_t error;
  undefined1 local_400 [232];
  char *local_318;
  long local_310;
  long local_308;
  undefined1 local_300 [112];
  undefined1 local_290 [8];
  undefined1 auStack_288 [640];
  
  local_318 = "{ \"key\" : { \"$numberDecimal\": \"11\" }}";
  bVar1 = bson_init_from_json(local_400,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,local_290);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s\n",auStack_288);
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x906,"test_bson_json_number_decimal","r");
    abort();
  }
  bVar1 = bson_iter_init(local_300,local_400);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x907,"test_bson_json_number_decimal","bson_iter_init (&iter, &b)");
    abort();
  }
  bVar1 = bson_iter_find(local_300,"key");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x908,"test_bson_json_number_decimal","bson_iter_find (&iter, \"key\")");
    abort();
  }
  iVar2 = bson_iter_type(local_300);
  if (iVar2 == 0x13) {
    bson_iter_decimal128(local_300,&local_310);
    if (local_310 != 0xb) {
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x90b,"test_bson_json_number_decimal","decimal128.low == 11");
      abort();
    }
    if (local_308 == 0x3040000000000000) {
      bson_destroy(local_400);
      return;
    }
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x90c,"test_bson_json_number_decimal","decimal128.high == 0x3040000000000000ULL");
    abort();
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x909,"test_bson_json_number_decimal","BSON_ITER_HOLDS_DECIMAL128 (&iter)");
  abort();
}

Assistant:

static void
test_bson_json_number_decimal (void)
{
   bson_error_t error;
   bson_iter_t iter;
   bson_decimal128_t decimal128;
   const char *json = "{ \"key\" : { \"$numberDecimal\": \"11\" }}";
   bson_t b;
   bool r;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);
   BSON_ASSERT (bson_iter_init (&iter, &b));
   BSON_ASSERT (bson_iter_find (&iter, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DECIMAL128 (&iter));
   bson_iter_decimal128 (&iter, &decimal128);
   BSON_ASSERT (decimal128.low == 11);
   BSON_ASSERT (decimal128.high == 0x3040000000000000ULL);
   bson_destroy (&b);
}